

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

Json __thiscall json11::anon_unknown_21::JsonParser::parse_number(JsonParser *this)

{
  bool bVar1;
  int value;
  char *pcVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  string *in_RSI;
  double value_00;
  Json JVar5;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  json11 local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  size_t start_pos;
  JsonParser *this_local;
  
  local_20 = *(long *)(in_RSI + 8);
  this_local = this;
  pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
  if (*pcVar2 == '-') {
    *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
  if (*pcVar2 == '0') {
    *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
    pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
    bVar1 = in_range((long)*pcVar2,0x30,0x39);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"leading 0s not permitted in numbers",&local_41);
      fail(this,in_RSI);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      _Var4._M_pi = extraout_RDX;
      goto LAB_001d97c6;
    }
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
    bVar1 = in_range((long)*pcVar2,0x31,0x39);
    if (!bVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
      esc_abi_cxx11_(local_b8,*pcVar2);
      std::operator+((char *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"invalid "
                    );
      std::operator+(local_78,(char *)local_98);
      fail(this,in_RSI);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string((string *)local_b8);
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_001d97c6;
    }
    *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
    while( true ) {
      pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
      bVar1 = in_range((long)*pcVar2,0x30,0x39);
      if (!bVar1) break;
      *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
    }
  }
  pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
  if ((((*pcVar2 == '.') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI), *pcVar2 == 'e')) ||
      (pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI), *pcVar2 == 'E')) ||
     (9 < (ulong)(*(long *)(in_RSI + 8) - local_20))) {
    pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
    if (*pcVar2 == '.') {
      *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
      pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
      bVar1 = in_range((long)*pcVar2,0x30,0x39);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d8,"at least one digit required in fractional part",&local_d9);
        fail(this,in_RSI);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        _Var4._M_pi = extraout_RDX_02;
        goto LAB_001d97c6;
      }
      while( true ) {
        pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
        bVar1 = in_range((long)*pcVar2,0x30,0x39);
        if (!bVar1) break;
        *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
      }
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
    if ((*pcVar2 == 'e') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI), *pcVar2 == 'E')) {
      *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
      pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
      if ((*pcVar2 == '+') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI), *pcVar2 == '-')) {
        *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
      bVar1 = in_range((long)*pcVar2,0x30,0x39);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"at least one digit required in exponent",&local_101)
        ;
        fail(this,in_RSI);
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        _Var4._M_pi = extraout_RDX_03;
        goto LAB_001d97c6;
      }
      while( true ) {
        pcVar2 = (char *)std::__cxx11::string::operator[](*(ulong *)in_RSI);
        bVar1 = in_range((long)*pcVar2,0x30,0x39);
        if (!bVar1) break;
        *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
      }
    }
    lVar3 = std::__cxx11::string::c_str();
    value_00 = strtod((char *)(lVar3 + local_20),(char **)0x0);
    Json::Json((Json *)this,value_00);
    _Var4._M_pi = extraout_RDX_04;
  }
  else {
    lVar3 = std::__cxx11::string::c_str();
    value = atoi((char *)(lVar3 + local_20));
    Json::Json((Json *)this,value);
    _Var4._M_pi = extraout_RDX_01;
  }
LAB_001d97c6:
  JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json parse_number() {
        size_t start_pos = i;

        if (str[i] == '-')
            i++;

        // Integer part
        if (str[i] == '0') {
            i++;
            if (in_range(str[i], '0', '9'))
                return fail("leading 0s not permitted in numbers");
        } else if (in_range(str[i], '1', '9')) {
            i++;
            while (in_range(str[i], '0', '9'))
                i++;
        } else {
            return fail("invalid " + esc(str[i]) + " in number");
        }

        if (str[i] != '.' && str[i] != 'e' && str[i] != 'E'
                && (i - start_pos) <= static_cast<size_t>(std::numeric_limits<int>::digits10)) {
            return std::atoi(str.c_str() + start_pos);
        }

        // Decimal part
        if (str[i] == '.') {
            i++;
            if (!in_range(str[i], '0', '9'))
                return fail("at least one digit required in fractional part");

            while (in_range(str[i], '0', '9'))
                i++;
        }

        // Exponent part
        if (str[i] == 'e' || str[i] == 'E') {
            i++;

            if (str[i] == '+' || str[i] == '-')
                i++;

            if (!in_range(str[i], '0', '9'))
                return fail("at least one digit required in exponent");

            while (in_range(str[i], '0', '9'))
                i++;
        }

        return std::strtod(str.c_str() + start_pos, nullptr);
    }